

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O3

void select_none_cb(Fl_Widget *param_1,void *param_2)

{
  bool bVar1;
  Fl_Type *pFVar2;
  Fl_Type *p;
  Fl_Type *pFVar3;
  fd_set *in_R8;
  timeval *in_R9;
  
  if (Fl_Type::current == (Fl_Type *)0x0) {
    pFVar2 = (Fl_Type *)0x0;
  }
  else {
    pFVar2 = Fl_Type::current->parent;
  }
  p = pFVar2;
  if (in_this_only == (Fl_Type *)0x0) {
LAB_001812a8:
    if (p == (Fl_Type *)0x0) goto LAB_001812f9;
  }
  else {
    pFVar3 = pFVar2;
    p = in_this_only;
    if (pFVar2 != in_this_only && pFVar2 != (Fl_Type *)0x0) {
      do {
        pFVar3 = pFVar3->parent;
        if (pFVar3 == (Fl_Type *)0x0) break;
      } while (pFVar3 != in_this_only);
      p = pFVar2;
      if (pFVar3 != in_this_only) {
        p = in_this_only;
      }
      goto LAB_001812a8;
    }
  }
  do {
    pFVar2 = p->next;
    if (pFVar2 != (Fl_Type *)0x0) {
      bVar1 = false;
      do {
        if (pFVar2->level <= p->level) break;
        if (pFVar2->new_selected != '\0') {
          Fl_Browser_::select(&widget_browser->super_Fl_Browser_,(int)pFVar2,(fd_set *)0x0,
                              (fd_set *)0x0,in_R8,in_R9);
          bVar1 = true;
        }
        pFVar2 = pFVar2->next;
      } while (pFVar2 != (Fl_Type *)0x0);
      if (bVar1) goto LAB_00181320;
    }
    p = p->parent;
  } while (p != (Fl_Type *)0x0);
LAB_001812f9:
  p = (Fl_Type *)0x0;
  for (pFVar2 = Fl_Type::first; pFVar2 != (Fl_Type *)0x0; pFVar2 = pFVar2->next) {
    Fl_Browser_::select(&widget_browser->super_Fl_Browser_,(int)pFVar2,(fd_set *)0x0,(fd_set *)0x0,
                        in_R8,in_R9);
  }
LAB_00181320:
  selection_changed(p);
  return;
}

Assistant:

void select_none_cb(Fl_Widget *,void *) {
  Fl_Type *p = Fl_Type::current ? Fl_Type::current->parent : 0;
  if (in_this_only) {
    Fl_Type *t = p;
    for (; t && t != in_this_only; t = t->parent) {/*empty*/}
    if (t != in_this_only) p = in_this_only;
  }
  for (;;) {
    if (p) {
      int foundany = 0;
      for (Fl_Type *t = p->next; t && t->level>p->level; t = t->next) {
	if (t->new_selected) {widget_browser->select(t,0,0); foundany = 1;}
      }
      if (foundany) break;
      p = p->parent;
    } else {
      for (Fl_Type *t = Fl_Type::first; t; t = t->next)
	widget_browser->select(t,0,0);
      break;
    }
  }
  selection_changed(p);
}